

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableBeginRow(ImGuiTable *table)

{
  long in_RDI;
  ImU32 unaff_retaddr;
  ImGuiTableBgTarget unaff_retaddr_00;
  float next_y1;
  ImGuiWindow *window;
  ImVec2 local_24;
  ImVec2 local_1c;
  undefined4 local_14;
  long lVar1;
  
  lVar1 = *(long *)(in_RDI + 0x188);
  *(int *)(in_RDI + 0x70) = *(int *)(in_RDI + 0x70) + 1;
  *(undefined4 *)(in_RDI + 0x74) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xa0) = 0x1000000;
  *(undefined4 *)(in_RDI + 0x9c) = 0x1000000;
  *(undefined2 *)(in_RDI + 0x22e) = 0xffff;
  *(undefined1 *)(in_RDI + 0x237) = 1;
  local_14 = *(undefined4 *)(in_RDI + 0x80);
  if ((*(int *)(in_RDI + 0x70) == 0) && (0 < *(short *)(in_RDI + 0x228))) {
    local_14 = *(undefined4 *)(in_RDI + 0xf4);
    *(undefined4 *)(lVar1 + 0x11c) = local_14;
  }
  *(undefined4 *)(in_RDI + 0x80) = local_14;
  *(undefined4 *)(in_RDI + 0x7c) = local_14;
  *(undefined4 *)(in_RDI + 0x8c) = 0;
  *(float *)(in_RDI + 0x90) = *(float *)(lVar1 + 0x15c) - *(float *)(in_RDI + 0xb4);
  *(undefined4 *)(lVar1 + 0x154) = 0;
  ImVec2::ImVec2(&local_1c,*(float *)(lVar1 + 0x118),
                 *(float *)(lVar1 + 0x11c) + *(float *)(in_RDI + 0x88));
  *(ImVec2 *)(lVar1 + 0x120) = local_1c;
  ImVec2::ImVec2(&local_24,0.0,0.0);
  *(ImVec2 *)(lVar1 + 0x140) = local_24;
  *(undefined8 *)(lVar1 + 0x148) = *(undefined8 *)(lVar1 + 0x140);
  *(undefined1 *)(lVar1 + 0x159) = 0;
  *(undefined1 *)(lVar1 + 0x158) = 0;
  *(undefined4 *)(lVar1 + 0x134) = local_14;
  if ((*(uint *)(in_RDI + 0x94) & 1) != 0) {
    GetColorU32((ImGuiCol)((ulong)lVar1 >> 0x20),(float)lVar1);
    TableSetBgColor(unaff_retaddr_00,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    if (*(int *)(in_RDI + 0x70) == 0) {
      *(undefined1 *)(in_RDI + 0x23a) = 1;
    }
  }
  return;
}

Assistant:

void ImGui::TableBeginRow(ImGuiTable* table)
{
    ImGuiWindow* window = table->InnerWindow;
    IM_ASSERT(!table->IsInsideRow);

    // New row
    table->CurrentRow++;
    table->CurrentColumn = -1;
    table->RowBgColor[0] = table->RowBgColor[1] = IM_COL32_DISABLE;
    table->RowCellDataCurrent = -1;
    table->IsInsideRow = true;

    // Begin frozen rows
    float next_y1 = table->RowPosY2;
    if (table->CurrentRow == 0 && table->FreezeRowsCount > 0)
        next_y1 = window->DC.CursorPos.y = table->OuterRect.Min.y;

    table->RowPosY1 = table->RowPosY2 = next_y1;
    table->RowTextBaseline = 0.0f;
    table->RowIndentOffsetX = window->DC.Indent.x - table->HostIndentX; // Lock indent

    window->DC.PrevLineTextBaseOffset = 0.0f;
    window->DC.CursorPosPrevLine = ImVec2(window->DC.CursorPos.x, window->DC.CursorPos.y + table->RowCellPaddingY); // This allows users to call SameLine() to share LineSize between columns.
    window->DC.PrevLineSize = window->DC.CurrLineSize = ImVec2(0.0f, 0.0f); // This allows users to call SameLine() to share LineSize between columns, and to call it from first column too.
    window->DC.IsSameLine = window->DC.IsSetPos = false;
    window->DC.CursorMaxPos.y = next_y1;

    // Making the header BG color non-transparent will allow us to overlay it multiple times when handling smooth dragging.
    if (table->RowFlags & ImGuiTableRowFlags_Headers)
    {
        TableSetBgColor(ImGuiTableBgTarget_RowBg0, GetColorU32(ImGuiCol_TableHeaderBg));
        if (table->CurrentRow == 0)
            table->IsUsingHeaders = true;
    }
}